

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HessenbergDecomposition.h
# Opt level: O3

HessenbergDecomposition<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> * __thiscall
Eigen::HessenbergDecomposition<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::compute
          (HessenbergDecomposition<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this,
          MatrixType *matrix)

{
  CoeffVectorType *hCoeffs;
  long lVar1;
  double *pdVar2;
  undefined8 *puVar3;
  ulong uVar4;
  
  PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)matrix);
  lVar1 = (matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_rows;
  if (1 < lVar1) {
    hCoeffs = &this->m_hCoeffs;
    uVar4 = lVar1 - 1;
    if ((this->m_hCoeffs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != uVar4) {
      free((hCoeffs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data);
      if (uVar4 >> 0x3d != 0) {
LAB_00125af1:
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = operator_delete;
        __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      pdVar2 = (double *)malloc(uVar4 * 8);
      if (pdVar2 == (double *)0x0) goto LAB_00125af1;
      (hCoeffs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
           pdVar2;
    }
    (this->m_hCoeffs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = uVar4;
    _compute(&this->m_matrix,hCoeffs,&this->m_temp);
  }
  this->m_isInitialized = true;
  return this;
}

Assistant:

HessenbergDecomposition& compute(const MatrixType& matrix)
    {
      m_matrix = matrix;
      if(matrix.rows()<2)
      {
        m_isInitialized = true;
        return *this;
      }
      m_hCoeffs.resize(matrix.rows()-1,1);
      _compute(m_matrix, m_hCoeffs, m_temp);
      m_isInitialized = true;
      return *this;
    }